

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListTest::getShaderBody
          (XFBStrideOfEmptyListTest *this,GLuint param_1,STAGES stage,string *out_assignments,
          string *out_calculations)

{
  char *local_30;
  GLchar *assignments;
  string *out_calculations_local;
  string *out_assignments_local;
  STAGES stage_local;
  GLuint param_3_local;
  XFBStrideOfEmptyListTest *this_local;
  
  std::__cxx11::string::operator=((string *)out_calculations,"");
  local_30 = "";
  if (stage == GEOMETRY) {
    local_30 = getShaderBody::gs;
  }
  else if (stage == FRAGMENT) {
    local_30 = getShaderBody::fs;
  }
  std::__cxx11::string::operator=((string *)out_assignments,local_30);
  return;
}

Assistant:

void XFBStrideOfEmptyListTest::getShaderBody(GLuint /* test_case_index */, Utils::Shader::STAGES stage,
											 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	static const GLchar* gs = "    gs_fs  = uni_gs;\n";
	static const GLchar* fs = "    fs_out = vec4(gs_fs);\n";

	const GLchar* assignments = "";
	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;
	case Utils::Shader::GEOMETRY:
		assignments = gs;
		break;
	default:
		break;
	}

	out_assignments = assignments;
}